

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O2

CBlockIndex **
inline_check_non_fatal<CBlockIndex_const*>
          (CBlockIndex **val,char *file,int line,char *func,char *assertion)

{
  long lVar1;
  string_view func_00;
  NonFatalCheckError *this;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  string_view msg;
  string_view file_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*val == (CBlockIndex *)0x0) {
    this = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    sVar2 = strlen(assertion);
    sVar3 = strlen(file);
    sVar4 = strlen(func);
    func_00._M_str = func;
    func_00._M_len = sVar4;
    msg._M_str = assertion;
    msg._M_len = sVar2;
    file_00._M_str = file;
    file_00._M_len = sVar3;
    NonFatalCheckError::NonFatalCheckError(this,msg,file_00,line,func_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return val;
  }
  __stack_chk_fail();
}

Assistant:

T&& inline_check_non_fatal(LIFETIMEBOUND T&& val, const char* file, int line, const char* func, const char* assertion)
{
    if (!val) {
        throw NonFatalCheckError{assertion, file, line, func};
    }
    return std::forward<T>(val);
}